

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cinproc.c
# Opt level: O0

void nn_cinproc_shutdown(nn_fsm *self,int src,int type,void *srcptr)

{
  int iVar1;
  nn_list_item *pnVar2;
  uint in_EDX;
  uint in_ESI;
  long in_RDI;
  nn_list_item *it;
  nn_sinproc *sinproc;
  nn_cinproc *cinproc;
  nn_list_item *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  long local_38;
  nn_list_item *local_30;
  
  local_38 = in_RDI;
  if (in_RDI == 0) {
    local_38 = 0;
  }
  if ((in_ESI == 0xfffffffe) && (in_EDX == 0xfffffffd)) {
    nn_ins_disconnect((nn_ins_item *)0x14b841);
    local_30 = nn_list_begin((nn_list *)(local_38 + 0x80));
    while (pnVar2 = nn_list_end((nn_list *)(local_38 + 0x80)), local_30 != pnVar2) {
      nn_sinproc_stop((nn_sinproc *)0x14b8b6);
      local_30 = nn_list_next((nn_list *)
                              CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                              in_stack_ffffffffffffffa8);
    }
    *(undefined4 *)(local_38 + 0x58) = 3;
  }
  else {
    if (*(int *)(local_38 + 0x58) != 3) {
      nn_backtrace_print();
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected state",
              (ulong)*(uint *)(local_38 + 0x58),(ulong)in_ESI,(ulong)in_EDX,
              "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/inproc/cinproc.c"
              ,0xaa);
      fflush(_stderr);
      nn_err_abort();
    }
    nn_list_erase((nn_list *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                  in_stack_ffffffffffffffa8);
    nn_sinproc_term((nn_sinproc *)0x14b91d);
    nn_free((void *)0x14b927);
  }
  iVar1 = nn_list_empty((nn_list *)(local_38 + 0x80));
  if (iVar1 != 0) {
    *(undefined4 *)(local_38 + 0x58) = 1;
    nn_fsm_stopped_noevent((nn_fsm *)0x14b958);
    nn_ep_stopped((nn_ep *)0x14b966);
  }
  return;
}

Assistant:

static void nn_cinproc_shutdown (struct nn_fsm *self, int src, int type,
    NN_UNUSED void *srcptr)
{
    struct nn_cinproc *cinproc;
    struct nn_sinproc *sinproc;
    struct nn_list_item *it;

    cinproc = nn_cont (self, struct nn_cinproc, fsm);

    if (src == NN_FSM_ACTION && type == NN_FSM_STOP) {

        /*  First, unregister the endpoint from the global repository of inproc
            endpoints. This way, new connections cannot be created anymore. */
        nn_ins_disconnect (&cinproc->item);

        /*  Stop the existing connection. */
        for (it = nn_list_begin (&cinproc->sinprocs);
              it != nn_list_end (&cinproc->sinprocs);
              it = nn_list_next (&cinproc->sinprocs, it)) {
            sinproc = nn_cont (it, struct nn_sinproc, item);
            nn_sinproc_stop (sinproc);
        }
        cinproc->state = NN_CINPROC_STATE_STOPPING;
        goto finish;
    }
    if (cinproc->state == NN_CINPROC_STATE_STOPPING) {
        sinproc = (struct nn_sinproc *) srcptr;
        nn_list_erase (&cinproc->sinprocs, &sinproc->item);
        nn_sinproc_term (sinproc);
        nn_free (sinproc);

finish:
        if (!nn_list_empty (&cinproc->sinprocs))
            return;
        cinproc->state = NN_CINPROC_STATE_IDLE;
        nn_fsm_stopped_noevent (&cinproc->fsm);
        nn_ep_stopped (cinproc->item.ep);
        return;
    }

    nn_fsm_bad_state(cinproc->state, src, type);
}